

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

bool __thiscall Liby::http::RequestParser::ParseURI(RequestParser *this,char *begin,char *end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  int local_48;
  int local_44;
  int j;
  int i;
  char *temp;
  char *src;
  int n;
  int query_index;
  char *end_local;
  char *begin_local;
  RequestParser *this_local;
  
  bVar5 = false;
  if ((begin <= end) && (bVar5 = false, begin != (char *)0x0)) {
    bVar5 = end != (char *)0x0;
  }
  if (!bVar5) {
    __assert_fail("begin <= end && begin && end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                  ,0xd2,"bool Liby::http::RequestParser::ParseURI(const char *, const char *)");
  }
  src._4_4_ = -1;
  iVar2 = (int)end - (int)begin;
  uVar4 = (ulong)(iVar2 + 1);
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pcVar3 = (char *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
  if (pcVar3 == (char *)0x0) {
    this->progress_ = 7;
    this_local._7_1_ = false;
  }
  else {
    local_48 = 0;
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      if (begin[local_44] == '%') {
        cVar1 = parse_hex(begin + (long)local_44 + 1);
        pcVar3[local_48] = cVar1;
        local_44 = local_44 + 2;
      }
      else {
        pcVar3[local_48] = begin[local_44];
      }
      if (pcVar3[local_48] == '?') {
        src._4_4_ = local_48;
        pcVar3[local_48] = '\0';
      }
      local_48 = local_48 + 1;
    }
    pcVar3[local_48] = '\0';
    if (src._4_4_ != -1) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_Request).query_,pcVar3 + (src._4_4_ + 1));
    }
    std::__cxx11::string::operator=((string *)&(this->super_Request).uri_,pcVar3);
    this->progress_ = 3;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RequestParser::ParseURI(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    do {
        int query_index = -1;
        int n = end - begin;
        const char *src = begin;
        char *temp = new (std::nothrow) char[n + 1];
        if (temp == nullptr)
            break;
        int i = 0, j = 0;
        for (; i < n; i++, j++) {
            if (src[i] == '%') {
                temp[j] = parse_hex(src + i + 1);
                i += 2;
            } else {
                temp[j] = src[i];
            }
            if (temp[j] == '?') {
                query_index = j;
                temp[j] = '\0';
            }
        }
        temp[j] = '\0';

        if (query_index != -1)
            query_ = &temp[query_index + 1];
        uri_ = temp;
        progress_ = ParsingVersion;
        return true;
    } while (0);

    progress_ = InvalidURI;
    return false;
}